

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_window_is_active(nk_context *ctx,char *name)

{
  int len;
  nk_hash hash;
  uint uVar1;
  nk_window *pnVar2;
  
  if (ctx != (nk_context *)0x0) {
    len = nk_strlen(name);
    hash = nk_murmur_hash(name,len,0x40);
    pnVar2 = nk_find_window(ctx,hash,name);
    if (pnVar2 == (nk_window *)0x0) {
      uVar1 = 0;
    }
    else {
      uVar1 = (uint)(pnVar2 == ctx->active);
    }
    return uVar1;
  }
  __assert_fail("ctx",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                ,0x409d,"int nk_window_is_active(struct nk_context *, const char *)");
}

Assistant:

NK_API int
nk_window_is_active(struct nk_context *ctx, const char *name)
{
    int title_len;
    nk_hash title_hash;
    struct nk_window *win;
    NK_ASSERT(ctx);
    if (!ctx) return 0;

    title_len = (int)nk_strlen(name);
    title_hash = nk_murmur_hash(name, (int)title_len, NK_WINDOW_TITLE);
    win = nk_find_window(ctx, title_hash, name);
    if (!win) return 0;
    return win == ctx->active;
}